

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  undefined1 (*pauVar1) [16];
  float *pfVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  char *pcVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  float fVar23;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar42;
  float fVar57;
  float fVar60;
  undefined1 auVar45 [16];
  float fVar62;
  undefined1 auVar46 [16];
  float fVar43;
  float fVar58;
  float fVar61;
  float fVar63;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar44;
  float fVar59;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar81;
  float fVar85;
  float fVar87;
  float fVar89;
  undefined1 auVar82 [16];
  float fVar86;
  float fVar88;
  float fVar90;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar93;
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar98;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  float fVar105;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar118 [16];
  float fVar122;
  float fVar124;
  float fVar125;
  vfloat4 b1;
  float fVar126;
  undefined1 auVar123 [16];
  float fVar127;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  
  pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar3 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  uVar17 = (ulong)uVar3;
  pcVar5 = (pBVar4->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar4->super_RawBufferView).stride;
  lVar18 = sVar6 * uVar17;
  uVar22 = (ulong)(uVar3 + 1);
  lVar19 = sVar6 * uVar22;
  pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar7 = (pBVar4->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar4->super_RawBufferView).stride;
  lVar21 = sVar6 * uVar17;
  lVar20 = sVar6 * uVar22;
  fVar23 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar8 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           normals.items;
  pcVar9 = (pBVar8->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar8->super_RawBufferView).stride;
  pauVar1 = (undefined1 (*) [16])(pcVar9 + sVar6 * uVar17);
  auVar49 = *pauVar1;
  auVar53 = *(undefined1 (*) [16])(pcVar9 + sVar6 * uVar22);
  pBVar8 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           dnormals.items;
  pcVar9 = (pBVar8->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar8->super_RawBufferView).stride;
  auVar82 = vinsertps_avx(*(undefined1 (*) [16])(pcVar5 + lVar18),
                          ZEXT416((uint)(fVar23 * *(float *)(pcVar5 + lVar18 + 0xc))),0x30);
  auVar91 = vinsertps_avx(*(undefined1 (*) [16])(pcVar7 + lVar21),
                          ZEXT416((uint)(fVar23 * *(float *)(pcVar7 + lVar21 + 0xc))),0x30);
  fVar86 = auVar82._0_4_;
  fVar127 = fVar86 + auVar91._0_4_ * 0.33333334;
  fVar88 = auVar82._4_4_;
  fVar132 = fVar88 + auVar91._4_4_ * 0.33333334;
  fVar90 = auVar82._8_4_;
  fVar133 = fVar90 + auVar91._8_4_ * 0.33333334;
  fVar93 = auVar82._12_4_;
  fVar134 = fVar93 + auVar91._12_4_ * 0.33333334;
  auVar82 = vinsertps_avx(*(undefined1 (*) [16])(pcVar5 + lVar19),
                          ZEXT416((uint)(fVar23 * *(float *)(pcVar5 + lVar19 + 0xc))),0x30);
  fVar98 = auVar82._0_4_;
  fVar101 = auVar82._4_4_;
  fVar102 = auVar82._8_4_;
  fVar103 = auVar82._12_4_;
  auVar91 = vinsertps_avx(*(undefined1 (*) [16])(pcVar7 + lVar20),
                          ZEXT416((uint)(fVar23 * *(float *)(pcVar7 + lVar20 + 0xc))),0x30);
  auVar45._0_4_ = auVar91._0_4_ * 0.33333334;
  auVar45._4_4_ = auVar91._4_4_ * 0.33333334;
  auVar45._8_4_ = auVar91._8_4_ * 0.33333334;
  auVar45._12_4_ = auVar91._12_4_ * 0.33333334;
  auVar29 = vsubps_avx(auVar82,auVar45);
  fVar42 = auVar29._0_4_ * 0.0;
  fVar57 = auVar29._4_4_ * 0.0;
  fVar60 = auVar29._8_4_ * 0.0;
  fVar62 = auVar29._12_4_ * 0.0;
  fVar23 = fVar98 * 0.0 + fVar42;
  fVar39 = fVar101 * 0.0 + fVar57;
  fVar40 = fVar102 * 0.0 + fVar60;
  fVar41 = fVar103 * 0.0 + fVar62;
  auVar46._0_4_ = fVar127 * 3.0 + fVar23;
  auVar46._4_4_ = fVar132 * 3.0 + fVar39;
  auVar46._8_4_ = fVar133 * 3.0 + fVar40;
  auVar46._12_4_ = fVar134 * 3.0 + fVar41;
  auVar64._0_4_ = fVar86 * 3.0;
  auVar64._4_4_ = fVar88 * 3.0;
  auVar64._8_4_ = fVar90 * 3.0;
  auVar64._12_4_ = fVar93 * 3.0;
  auVar46 = vsubps_avx(auVar46,auVar64);
  pfVar2 = (float *)(pcVar9 + uVar17 * sVar6);
  fVar117 = *(float *)*pauVar1 + *pfVar2 * 0.33333334;
  fVar119 = *(float *)(*pauVar1 + 4) + pfVar2[1] * 0.33333334;
  fVar120 = *(float *)(*pauVar1 + 8) + pfVar2[2] * 0.33333334;
  fVar121 = *(float *)(*pauVar1 + 0xc) + pfVar2[3] * 0.33333334;
  fVar104 = auVar53._0_4_;
  fVar111 = auVar53._4_4_;
  fVar113 = auVar53._8_4_;
  fVar115 = auVar53._12_4_;
  pfVar2 = (float *)(pcVar9 + sVar6 * uVar22);
  auVar65._0_4_ = *pfVar2 * 0.33333334;
  auVar65._4_4_ = pfVar2[1] * 0.33333334;
  auVar65._8_4_ = pfVar2[2] * 0.33333334;
  auVar65._12_4_ = pfVar2[3] * 0.33333334;
  auVar54 = vsubps_avx(auVar53,auVar65);
  fVar81 = auVar54._0_4_ * 0.0;
  fVar85 = auVar54._4_4_ * 0.0;
  fVar87 = auVar54._8_4_ * 0.0;
  fVar89 = auVar54._12_4_ * 0.0;
  fVar105 = fVar104 * 0.0 + fVar81;
  fVar112 = fVar111 * 0.0 + fVar85;
  fVar114 = fVar113 * 0.0 + fVar87;
  fVar116 = fVar115 * 0.0 + fVar89;
  fVar43 = fVar117 * 0.0;
  fVar58 = fVar119 * 0.0;
  fVar61 = fVar120 * 0.0;
  fVar63 = fVar121 * 0.0;
  auVar47._0_4_ = *(float *)*pauVar1 + fVar105 + fVar43;
  auVar47._4_4_ = *(float *)(*pauVar1 + 4) + fVar112 + fVar58;
  auVar47._8_4_ = *(float *)(*pauVar1 + 8) + fVar114 + fVar61;
  auVar47._12_4_ = *(float *)(*pauVar1 + 0xc) + fVar116 + fVar63;
  auVar25 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar66._0_4_ = auVar25._0_4_ * auVar47._0_4_;
  auVar66._4_4_ = auVar25._4_4_ * auVar47._4_4_;
  auVar66._8_4_ = auVar25._8_4_ * auVar47._8_4_;
  auVar66._12_4_ = auVar25._12_4_ * auVar47._12_4_;
  auVar53 = vshufps_avx(auVar47,auVar47,0xc9);
  fVar122 = auVar46._0_4_;
  auVar48._0_4_ = fVar122 * auVar53._0_4_;
  fVar124 = auVar46._4_4_;
  auVar48._4_4_ = fVar124 * auVar53._4_4_;
  fVar125 = auVar46._8_4_;
  auVar48._8_4_ = fVar125 * auVar53._8_4_;
  fVar126 = auVar46._12_4_;
  auVar48._12_4_ = fVar126 * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar66,auVar48);
  auVar45 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar44 = auVar53._0_4_;
  auVar76._4_12_ = ZEXT812(0) << 0x20;
  auVar76._0_4_ = fVar44;
  auVar82 = vrsqrtss_avx(auVar76,auVar76);
  fVar59 = auVar82._0_4_;
  fVar127 = fVar127 * 0.0;
  fVar132 = fVar132 * 0.0;
  fVar133 = fVar133 * 0.0;
  fVar134 = fVar134 * 0.0;
  auVar139._0_4_ = fVar86 + fVar127 + fVar23;
  auVar139._4_4_ = fVar88 + fVar132 + fVar39;
  auVar139._8_4_ = fVar90 + fVar133 + fVar40;
  auVar139._12_4_ = fVar93 + fVar134 + fVar41;
  auVar82 = ZEXT416((uint)(fVar59 * 1.5 - fVar59 * fVar59 * fVar44 * 0.5 * fVar59));
  auVar26 = vshufps_avx(auVar82,auVar82,0);
  auVar47 = *(undefined1 (*) [16])(space->vy).field_0.m128;
  auVar27 = vshufps_avx(auVar139,auVar139,0xff);
  fVar23 = auVar26._0_4_ * auVar45._0_4_;
  fVar39 = auVar26._4_4_ * auVar45._4_4_;
  fVar40 = auVar26._8_4_ * auVar45._8_4_;
  fVar41 = auVar26._12_4_ * auVar45._12_4_;
  local_108._0_4_ = fVar23 * auVar27._0_4_;
  local_108._4_4_ = fVar39 * auVar27._4_4_;
  fStack_100 = fVar40 * auVar27._8_4_;
  fStack_fc = fVar41 * auVar27._12_4_;
  auVar24._0_4_ = auVar139._0_4_ + (float)local_108._0_4_;
  auVar24._4_4_ = auVar139._4_4_ + (float)local_108._4_4_;
  auVar24._8_4_ = auVar139._8_4_ + fStack_100;
  auVar24._12_4_ = auVar139._12_4_ + fStack_fc;
  auVar82 = vshufps_avx(auVar24,auVar24,0x55);
  auVar48 = *(undefined1 (*) [16])(space->vz).field_0.m128;
  auVar91 = vshufps_avx(auVar24,auVar24,0xaa);
  auVar50 = *(undefined1 (*) [16])(space->vx).field_0.m128;
  auVar28 = vshufps_avx(auVar24,auVar24,0);
  local_198._4_4_ =
       auVar28._4_4_ * (space->vx).field_0.m128[1] +
       auVar82._4_4_ * (space->vy).field_0.m128[1] + auVar91._4_4_ * (space->vz).field_0.m128[1];
  local_198._0_4_ =
       auVar28._0_4_ * (space->vx).field_0.m128[0] +
       auVar82._0_4_ * (space->vy).field_0.m128[0] + auVar91._0_4_ * (space->vz).field_0.m128[0];
  fStack_190 = auVar28._8_4_ * (space->vx).field_0.m128[2] +
               auVar82._8_4_ * (space->vy).field_0.m128[2] +
               auVar91._8_4_ * (space->vz).field_0.m128[2];
  fStack_18c = auVar28._12_4_ * (space->vx).field_0.m128[3] +
               auVar82._12_4_ * (space->vy).field_0.m128[3] +
               auVar91._12_4_ * (space->vz).field_0.m128[3];
  auVar28 = vshufps_avx(auVar46,auVar46,0xff);
  auVar91 = vrcpss_avx(auVar76,auVar76);
  auVar106._0_4_ = fVar117 * 3.0 + fVar105;
  auVar106._4_4_ = fVar119 * 3.0 + fVar112;
  auVar106._8_4_ = fVar120 * 3.0 + fVar114;
  auVar106._12_4_ = fVar121 * 3.0 + fVar116;
  local_2f8 = auVar49._0_4_;
  fStack_2f4 = auVar49._4_4_;
  fStack_2f0 = auVar49._8_4_;
  fStack_2ec = auVar49._12_4_;
  auVar118._0_4_ = local_2f8 * 3.0;
  auVar118._4_4_ = fStack_2f4 * 3.0;
  auVar118._8_4_ = fStack_2f0 * 3.0;
  auVar118._12_4_ = fStack_2ec * 3.0;
  auVar82 = vsubps_avx(auVar106,auVar118);
  auVar94._0_4_ = auVar82._0_4_ * auVar25._0_4_;
  auVar94._4_4_ = auVar82._4_4_ * auVar25._4_4_;
  auVar94._8_4_ = auVar82._8_4_ * auVar25._8_4_;
  auVar94._12_4_ = auVar82._12_4_ * auVar25._12_4_;
  auVar82 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar107._0_4_ = fVar122 * auVar82._0_4_;
  auVar107._4_4_ = fVar124 * auVar82._4_4_;
  auVar107._8_4_ = fVar125 * auVar82._8_4_;
  auVar107._12_4_ = fVar126 * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar94,auVar107);
  auVar25 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar82 = vdpps_avx(auVar45,auVar25,0x7f);
  auVar53 = vshufps_avx(auVar53,auVar53,0);
  auVar49._0_4_ = auVar53._0_4_ * auVar25._0_4_;
  auVar49._4_4_ = auVar53._4_4_ * auVar25._4_4_;
  auVar49._8_4_ = auVar53._8_4_ * auVar25._8_4_;
  auVar49._12_4_ = auVar53._12_4_ * auVar25._12_4_;
  auVar53 = vshufps_avx(auVar82,auVar82,0);
  auVar67._0_4_ = auVar53._0_4_ * auVar45._0_4_;
  auVar67._4_4_ = auVar53._4_4_ * auVar45._4_4_;
  auVar67._8_4_ = auVar53._8_4_ * auVar45._8_4_;
  auVar67._12_4_ = auVar53._12_4_ * auVar45._12_4_;
  auVar82 = vsubps_avx(auVar49,auVar67);
  auVar53 = ZEXT416((uint)((2.0 - fVar44 * auVar91._0_4_) * auVar91._0_4_));
  auVar53 = vshufps_avx(auVar53,auVar53,0);
  fVar44 = auVar28._0_4_ * fVar23 + auVar27._0_4_ * auVar26._0_4_ * auVar53._0_4_ * auVar82._0_4_;
  fVar59 = auVar28._4_4_ * fVar39 + auVar27._4_4_ * auVar26._4_4_ * auVar53._4_4_ * auVar82._4_4_;
  fVar105 = auVar28._8_4_ * fVar40 + auVar27._8_4_ * auVar26._8_4_ * auVar53._8_4_ * auVar82._8_4_;
  fVar112 = auVar28._12_4_ * fVar41 +
            auVar27._12_4_ * auVar26._12_4_ * auVar53._12_4_ * auVar82._12_4_;
  auVar25._0_4_ = auVar24._0_4_ + (fVar122 + fVar44) * 0.33333334;
  auVar25._4_4_ = auVar24._4_4_ + (fVar124 + fVar59) * 0.33333334;
  auVar25._8_4_ = auVar24._8_4_ + (fVar125 + fVar105) * 0.33333334;
  auVar25._12_4_ = auVar24._12_4_ + (fVar126 + fVar112) * 0.33333334;
  auVar53 = vshufps_avx(auVar25,auVar25,0x55);
  local_1b8 = auVar47._0_4_;
  fStack_1b4 = auVar47._4_4_;
  fStack_1b0 = auVar47._8_4_;
  fStack_1ac = auVar47._12_4_;
  auVar82 = vshufps_avx(auVar25,auVar25,0xaa);
  local_1d8 = auVar48._0_4_;
  fStack_1d4 = auVar48._4_4_;
  fStack_1d0 = auVar48._8_4_;
  fStack_1cc = auVar48._12_4_;
  auVar91 = vshufps_avx(auVar25,auVar25,0);
  local_1f8 = auVar50._0_4_;
  fStack_1f4 = auVar50._4_4_;
  fStack_1f0 = auVar50._8_4_;
  fStack_1ec = auVar50._12_4_;
  local_218._4_4_ =
       fStack_1f4 * auVar91._4_4_ + fStack_1b4 * auVar53._4_4_ + fStack_1d4 * auVar82._4_4_;
  local_218._0_4_ =
       local_1f8 * auVar91._0_4_ + local_1b8 * auVar53._0_4_ + local_1d8 * auVar82._0_4_;
  fStack_210 = fStack_1f0 * auVar91._8_4_ + fStack_1b0 * auVar53._8_4_ + fStack_1d0 * auVar82._8_4_;
  fStack_20c = fStack_1ec * auVar91._12_4_ +
               fStack_1ac * auVar53._12_4_ + fStack_1cc * auVar82._12_4_;
  auVar50._0_4_ = fVar98 * 3.0;
  auVar50._4_4_ = fVar101 * 3.0;
  auVar50._8_4_ = fVar102 * 3.0;
  auVar50._12_4_ = fVar103 * 3.0;
  auVar68._0_4_ = auVar29._0_4_ * 3.0;
  auVar68._4_4_ = auVar29._4_4_ * 3.0;
  auVar68._8_4_ = auVar29._8_4_ * 3.0;
  auVar68._12_4_ = auVar29._12_4_ * 3.0;
  auVar53 = vsubps_avx(auVar50,auVar68);
  auVar51._0_4_ = fVar127 + auVar53._0_4_;
  auVar51._4_4_ = fVar132 + auVar53._4_4_;
  auVar51._8_4_ = fVar133 + auVar53._8_4_;
  auVar51._12_4_ = fVar134 + auVar53._12_4_;
  auVar69._0_4_ = fVar86 * 0.0;
  auVar69._4_4_ = fVar88 * 0.0;
  auVar69._8_4_ = fVar90 * 0.0;
  auVar69._12_4_ = fVar93 * 0.0;
  auVar99._0_4_ = auVar69._0_4_ + fVar127 + fVar98 + fVar42;
  auVar99._4_4_ = auVar69._4_4_ + fVar132 + fVar101 + fVar57;
  auVar99._8_4_ = auVar69._8_4_ + fVar133 + fVar102 + fVar60;
  auVar99._12_4_ = auVar69._12_4_ + fVar134 + fVar103 + fVar62;
  auVar45 = vsubps_avx(auVar51,auVar69);
  auVar70._0_4_ = local_2f8 * 0.0;
  auVar70._4_4_ = fStack_2f4 * 0.0;
  auVar70._8_4_ = fStack_2f0 * 0.0;
  auVar70._12_4_ = fStack_2ec * 0.0;
  auVar26._0_4_ = auVar70._0_4_ + fVar43 + fVar104 + fVar81;
  auVar26._4_4_ = auVar70._4_4_ + fVar58 + fVar111 + fVar85;
  auVar26._8_4_ = auVar70._8_4_ + fVar61 + fVar113 + fVar87;
  auVar26._12_4_ = auVar70._12_4_ + fVar63 + fVar115 + fVar89;
  auVar91 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar52._0_4_ = auVar91._0_4_ * auVar26._0_4_;
  auVar52._4_4_ = auVar91._4_4_ * auVar26._4_4_;
  auVar52._8_4_ = auVar91._8_4_ * auVar26._8_4_;
  auVar52._12_4_ = auVar91._12_4_ * auVar26._12_4_;
  auVar53 = vshufps_avx(auVar26,auVar26,0xc9);
  fVar42 = auVar45._0_4_;
  auVar27._0_4_ = fVar42 * auVar53._0_4_;
  fVar57 = auVar45._4_4_;
  auVar27._4_4_ = fVar57 * auVar53._4_4_;
  fVar81 = auVar45._8_4_;
  auVar27._8_4_ = fVar81 * auVar53._8_4_;
  fVar85 = auVar45._12_4_;
  auVar27._12_4_ = fVar85 * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar52,auVar27);
  auVar25 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vdpps_avx(auVar25,auVar25,0x7f);
  fVar23 = auVar53._0_4_;
  auVar27 = ZEXT416((uint)fVar23);
  auVar82 = vrsqrtss_avx(auVar27,auVar27);
  fVar39 = auVar82._0_4_;
  auVar95._0_4_ = fVar104 * 3.0;
  auVar95._4_4_ = fVar111 * 3.0;
  auVar95._8_4_ = fVar113 * 3.0;
  auVar95._12_4_ = fVar115 * 3.0;
  auVar108._0_4_ = auVar54._0_4_ * 3.0;
  auVar108._4_4_ = auVar54._4_4_ * 3.0;
  auVar108._8_4_ = auVar54._8_4_ * 3.0;
  auVar108._12_4_ = auVar54._12_4_ * 3.0;
  auVar82 = vsubps_avx(auVar95,auVar108);
  auVar96._0_4_ = fVar43 + auVar82._0_4_;
  auVar96._4_4_ = fVar58 + auVar82._4_4_;
  auVar96._8_4_ = fVar61 + auVar82._8_4_;
  auVar96._12_4_ = fVar63 + auVar82._12_4_;
  auVar82 = vsubps_avx(auVar96,auVar70);
  auVar77._0_4_ = auVar91._0_4_ * auVar82._0_4_;
  auVar77._4_4_ = auVar91._4_4_ * auVar82._4_4_;
  auVar77._8_4_ = auVar91._8_4_ * auVar82._8_4_;
  auVar77._12_4_ = auVar91._12_4_ * auVar82._12_4_;
  auVar82 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar71._0_4_ = fVar42 * auVar82._0_4_;
  auVar71._4_4_ = fVar57 * auVar82._4_4_;
  auVar71._8_4_ = fVar81 * auVar82._8_4_;
  auVar71._12_4_ = fVar85 * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar77,auVar71);
  auVar82 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar53 = vshufps_avx(auVar53,auVar53,0);
  auVar78._0_4_ = auVar53._0_4_ * auVar82._0_4_;
  auVar78._4_4_ = auVar53._4_4_ * auVar82._4_4_;
  auVar78._8_4_ = auVar53._8_4_ * auVar82._8_4_;
  auVar78._12_4_ = auVar53._12_4_ * auVar82._12_4_;
  auVar53 = vdpps_avx(auVar25,auVar82,0x7f);
  auVar53 = vshufps_avx(auVar53,auVar53,0);
  auVar72._0_4_ = auVar53._0_4_ * auVar25._0_4_;
  auVar72._4_4_ = auVar53._4_4_ * auVar25._4_4_;
  auVar72._8_4_ = auVar53._8_4_ * auVar25._8_4_;
  auVar72._12_4_ = auVar53._12_4_ * auVar25._12_4_;
  auVar26 = vsubps_avx(auVar78,auVar72);
  auVar53 = vrcpss_avx(auVar27,auVar27);
  auVar53 = ZEXT416((uint)(auVar53._0_4_ * (2.0 - fVar23 * auVar53._0_4_)));
  auVar53 = vshufps_avx(auVar53,auVar53,0);
  auVar82 = vshufps_avx(auVar99,auVar99,0xff);
  auVar91 = ZEXT416((uint)(fVar39 * 1.5 - fVar23 * 0.5 * fVar39 * fVar39 * fVar39));
  auVar91 = vshufps_avx(auVar91,auVar91,0);
  fVar23 = auVar25._0_4_ * auVar91._0_4_;
  fVar39 = auVar25._4_4_ * auVar91._4_4_;
  fVar40 = auVar25._8_4_ * auVar91._8_4_;
  fVar41 = auVar25._12_4_ * auVar91._12_4_;
  auVar25 = vshufps_avx(auVar45,auVar45,0xff);
  fVar89 = auVar82._0_4_ * fVar23;
  fVar86 = auVar82._4_4_ * fVar39;
  fVar88 = auVar82._8_4_ * fVar40;
  fVar90 = auVar82._12_4_ * fVar41;
  auVar54._0_4_ = auVar99._0_4_ + fVar89;
  auVar54._4_4_ = auVar99._4_4_ + fVar86;
  auVar54._8_4_ = auVar99._8_4_ + fVar88;
  auVar54._12_4_ = auVar99._12_4_ + fVar90;
  fVar58 = auVar25._0_4_ * fVar23 + auVar82._0_4_ * auVar91._0_4_ * auVar26._0_4_ * auVar53._0_4_;
  fVar60 = auVar25._4_4_ * fVar39 + auVar82._4_4_ * auVar91._4_4_ * auVar26._4_4_ * auVar53._4_4_;
  fVar61 = auVar25._8_4_ * fVar40 + auVar82._8_4_ * auVar91._8_4_ * auVar26._8_4_ * auVar53._8_4_;
  fVar62 = auVar25._12_4_ * fVar41 +
           auVar82._12_4_ * auVar91._12_4_ * auVar26._12_4_ * auVar53._12_4_;
  auVar28._0_4_ = (fVar42 + fVar58) * 0.33333334;
  auVar28._4_4_ = (fVar57 + fVar60) * 0.33333334;
  auVar28._8_4_ = (fVar81 + fVar61) * 0.33333334;
  auVar28._12_4_ = (fVar85 + fVar62) * 0.33333334;
  auVar91 = vsubps_avx(auVar54,auVar28);
  auVar53 = vshufps_avx(auVar91,auVar91,0x55);
  auVar82 = vshufps_avx(auVar91,auVar91,0xaa);
  auVar91 = vshufps_avx(auVar91,auVar91,0);
  auVar123._0_4_ = local_1f8 * auVar91._0_4_ + local_1b8 * auVar53._0_4_ + local_1d8 * auVar82._0_4_
  ;
  auVar123._4_4_ =
       fStack_1f4 * auVar91._4_4_ + fStack_1b4 * auVar53._4_4_ + fStack_1d4 * auVar82._4_4_;
  auVar123._8_4_ =
       fStack_1f0 * auVar91._8_4_ + fStack_1b0 * auVar53._8_4_ + fStack_1d0 * auVar82._8_4_;
  auVar123._12_4_ =
       fStack_1ec * auVar91._12_4_ + fStack_1ac * auVar53._12_4_ + fStack_1cc * auVar82._12_4_;
  auVar53 = vshufps_avx(auVar54,auVar54,0x55);
  auVar82 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar91 = vshufps_avx(auVar54,auVar54,0);
  auVar128._0_4_ = local_1f8 * auVar91._0_4_ + local_1b8 * auVar53._0_4_ + local_1d8 * auVar82._0_4_
  ;
  auVar128._4_4_ =
       fStack_1f4 * auVar91._4_4_ + fStack_1b4 * auVar53._4_4_ + fStack_1d4 * auVar82._4_4_;
  auVar128._8_4_ =
       fStack_1f0 * auVar91._8_4_ + fStack_1b0 * auVar53._8_4_ + fStack_1d0 * auVar82._8_4_;
  auVar128._12_4_ =
       fStack_1ec * auVar91._12_4_ + fStack_1ac * auVar53._12_4_ + fStack_1cc * auVar82._12_4_;
  auVar53 = vshufps_avx(auVar123,auVar123,0xaa);
  auVar82 = vshufps_avx(auVar128,auVar128,0xaa);
  fVar63 = auVar53._0_4_;
  fVar81 = auVar53._4_4_;
  fVar85 = auVar53._8_4_;
  fVar87 = auVar53._12_4_;
  fVar23 = auVar82._0_4_;
  fVar40 = auVar82._4_4_;
  fVar42 = auVar82._8_4_;
  fVar57 = auVar82._12_4_;
  auVar53 = vshufps_avx(_local_218,_local_218,0xaa);
  fVar39 = auVar53._0_4_;
  fVar41 = auVar53._4_4_;
  fVar43 = auVar53._8_4_;
  auVar82 = vshufps_avx(_local_198,_local_198,0xaa);
  fVar93 = auVar82._0_4_;
  fVar98 = auVar82._4_4_;
  fVar101 = auVar82._8_4_;
  auVar135._0_4_ =
       fVar93 * (float)bezier_basis0._476_4_ +
       (float)bezier_basis0._1632_4_ * fVar39 +
       fVar63 * (float)bezier_basis0._2788_4_ + (float)bezier_basis0._3944_4_ * fVar23;
  auVar135._4_4_ =
       fVar98 * (float)bezier_basis0._480_4_ +
       (float)bezier_basis0._1636_4_ * fVar41 +
       fVar81 * (float)bezier_basis0._2792_4_ + (float)bezier_basis0._3948_4_ * fVar40;
  auVar135._8_4_ =
       fVar101 * (float)bezier_basis0._484_4_ +
       (float)bezier_basis0._1640_4_ * fVar43 +
       fVar85 * (float)bezier_basis0._2796_4_ + (float)bezier_basis0._3952_4_ * fVar42;
  auVar135._12_4_ =
       auVar82._12_4_ * (float)bezier_basis0._488_4_ +
       (float)bezier_basis0._1644_4_ * auVar53._12_4_ +
       fVar87 * (float)bezier_basis0._2800_4_ + (float)bezier_basis0._3956_4_ * fVar57;
  auVar135._16_4_ =
       fVar93 * (float)bezier_basis0._492_4_ +
       (float)bezier_basis0._1648_4_ * fVar39 +
       fVar63 * (float)bezier_basis0._2804_4_ + (float)bezier_basis0._3960_4_ * fVar23;
  auVar135._20_4_ =
       fVar98 * (float)bezier_basis0._496_4_ +
       (float)bezier_basis0._1652_4_ * fVar41 +
       fVar81 * (float)bezier_basis0._2808_4_ + (float)bezier_basis0._3964_4_ * fVar40;
  auVar135._24_4_ =
       fVar101 * (float)bezier_basis0._500_4_ +
       (float)bezier_basis0._1656_4_ * fVar43 +
       fVar85 * (float)bezier_basis0._2812_4_ + (float)bezier_basis0._3968_4_ * fVar42;
  auVar135._28_4_ = (float)bezier_basis0._2816_4_ + 0.0 + 0.0 + 0.0;
  auVar79._0_4_ =
       fVar93 * (float)bezier_basis0._5100_4_ +
       fVar39 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar63 + fVar23 * (float)bezier_basis0._8568_4_;
  auVar79._4_4_ =
       fVar98 * (float)bezier_basis0._5104_4_ +
       fVar41 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar81 + fVar40 * (float)bezier_basis0._8572_4_;
  auVar79._8_4_ =
       fVar101 * (float)bezier_basis0._5108_4_ +
       fVar43 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar85 + fVar42 * (float)bezier_basis0._8576_4_;
  auVar79._12_4_ =
       auVar82._12_4_ * (float)bezier_basis0._5112_4_ +
       auVar53._12_4_ * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * fVar87 + fVar57 * (float)bezier_basis0._8580_4_;
  auVar79._16_4_ =
       fVar93 * (float)bezier_basis0._5116_4_ +
       fVar39 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar63 + fVar23 * (float)bezier_basis0._8584_4_;
  auVar79._20_4_ =
       fVar98 * (float)bezier_basis0._5120_4_ +
       fVar41 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar81 + fVar40 * (float)bezier_basis0._8588_4_;
  auVar79._24_4_ =
       fVar101 * (float)bezier_basis0._5124_4_ +
       fVar43 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar85 + fVar42 * (float)bezier_basis0._8592_4_;
  auVar79._28_4_ = fVar57 + fVar57 + fVar87 + fVar57;
  auVar30 = vblendps_avx(auVar79,ZEXT832(0) << 0x20,1);
  auVar10._4_4_ = auVar30._4_4_ * 0.055555556;
  auVar10._0_4_ = auVar30._0_4_ * 0.055555556;
  auVar10._8_4_ = auVar30._8_4_ * 0.055555556;
  auVar10._12_4_ = auVar30._12_4_ * 0.055555556;
  auVar10._16_4_ = auVar30._16_4_ * 0.055555556;
  auVar10._20_4_ = auVar30._20_4_ * 0.055555556;
  auVar10._24_4_ = auVar30._24_4_ * 0.055555556;
  auVar10._28_4_ = auVar30._28_4_;
  auVar14 = vsubps_avx(auVar135,auVar10);
  auVar30 = vblendps_avx(auVar79,ZEXT832(0) << 0x20,0x80);
  auVar80._0_4_ = auVar135._0_4_ + auVar30._0_4_ * 0.055555556;
  auVar80._4_4_ = auVar135._4_4_ + auVar30._4_4_ * 0.055555556;
  auVar80._8_4_ = auVar135._8_4_ + auVar30._8_4_ * 0.055555556;
  auVar80._12_4_ = auVar135._12_4_ + auVar30._12_4_ * 0.055555556;
  auVar80._16_4_ = auVar135._16_4_ + auVar30._16_4_ * 0.055555556;
  auVar80._20_4_ = auVar135._20_4_ + auVar30._20_4_ * 0.055555556;
  auVar80._24_4_ = auVar135._24_4_ + auVar30._24_4_ * 0.055555556;
  auVar80._28_4_ = auVar135._28_4_ + auVar30._28_4_;
  auVar55._8_4_ = 0xff800000;
  auVar55._0_8_ = 0xff800000ff800000;
  auVar55._12_4_ = 0xff800000;
  auVar55._16_4_ = 0xff800000;
  auVar55._20_4_ = 0xff800000;
  auVar55._24_4_ = 0xff800000;
  auVar55._28_4_ = 0xff800000;
  auVar30 = vmaxps_avx(auVar55,auVar135);
  auVar10 = vmaxps_avx(auVar14,auVar80);
  auVar55 = vmaxps_avx(auVar30,auVar10);
  auVar53 = vshufps_avx(auVar123,auVar123,0x55);
  auVar82 = vshufps_avx(auVar128,auVar128,0x55);
  fVar23 = auVar53._0_4_;
  fVar39 = auVar53._4_4_;
  fVar40 = auVar53._8_4_;
  fVar41 = auVar53._12_4_;
  fVar42 = auVar82._0_4_;
  fVar43 = auVar82._4_4_;
  fVar57 = auVar82._8_4_;
  fVar63 = auVar82._12_4_;
  auVar53 = vshufps_avx(_local_218,_local_218,0x55);
  fVar81 = auVar53._0_4_;
  fVar85 = auVar53._4_4_;
  fVar87 = auVar53._8_4_;
  auVar82 = vshufps_avx(_local_198,_local_198,0x55);
  fVar93 = auVar82._0_4_;
  fVar98 = auVar82._4_4_;
  fVar101 = auVar82._8_4_;
  auVar110._0_4_ =
       fVar93 * (float)bezier_basis0._476_4_ +
       fVar81 * (float)bezier_basis0._1632_4_ +
       fVar23 * (float)bezier_basis0._2788_4_ + fVar42 * (float)bezier_basis0._3944_4_;
  auVar110._4_4_ =
       fVar98 * (float)bezier_basis0._480_4_ +
       fVar85 * (float)bezier_basis0._1636_4_ +
       fVar39 * (float)bezier_basis0._2792_4_ + fVar43 * (float)bezier_basis0._3948_4_;
  auVar110._8_4_ =
       fVar101 * (float)bezier_basis0._484_4_ +
       fVar87 * (float)bezier_basis0._1640_4_ +
       fVar40 * (float)bezier_basis0._2796_4_ + fVar57 * (float)bezier_basis0._3952_4_;
  auVar110._12_4_ =
       auVar82._12_4_ * (float)bezier_basis0._488_4_ +
       auVar53._12_4_ * (float)bezier_basis0._1644_4_ +
       fVar41 * (float)bezier_basis0._2800_4_ + fVar63 * (float)bezier_basis0._3956_4_;
  auVar110._16_4_ =
       fVar93 * (float)bezier_basis0._492_4_ +
       fVar81 * (float)bezier_basis0._1648_4_ +
       fVar23 * (float)bezier_basis0._2804_4_ + fVar42 * (float)bezier_basis0._3960_4_;
  auVar110._20_4_ =
       fVar98 * (float)bezier_basis0._496_4_ +
       fVar85 * (float)bezier_basis0._1652_4_ +
       fVar39 * (float)bezier_basis0._2808_4_ + fVar43 * (float)bezier_basis0._3964_4_;
  auVar110._24_4_ =
       fVar101 * (float)bezier_basis0._500_4_ +
       fVar87 * (float)bezier_basis0._1656_4_ +
       fVar40 * (float)bezier_basis0._2812_4_ + fVar57 * (float)bezier_basis0._3968_4_;
  auVar110._28_4_ =
       (float)bezier_basis0._504_4_ +
       (float)bezier_basis0._1660_4_ + (float)bezier_basis0._3972_4_ + 0.0;
  auVar136._0_4_ =
       fVar93 * (float)bezier_basis0._5100_4_ +
       fVar81 * (float)bezier_basis0._6256_4_ +
       fVar42 * (float)bezier_basis0._8568_4_ + (float)bezier_basis0._7412_4_ * fVar23;
  auVar136._4_4_ =
       fVar98 * (float)bezier_basis0._5104_4_ +
       fVar85 * (float)bezier_basis0._6260_4_ +
       fVar43 * (float)bezier_basis0._8572_4_ + (float)bezier_basis0._7416_4_ * fVar39;
  auVar136._8_4_ =
       fVar101 * (float)bezier_basis0._5108_4_ +
       fVar87 * (float)bezier_basis0._6264_4_ +
       fVar57 * (float)bezier_basis0._8576_4_ + (float)bezier_basis0._7420_4_ * fVar40;
  auVar136._12_4_ =
       auVar82._12_4_ * (float)bezier_basis0._5112_4_ +
       auVar53._12_4_ * (float)bezier_basis0._6268_4_ +
       fVar63 * (float)bezier_basis0._8580_4_ + (float)bezier_basis0._7424_4_ * fVar41;
  auVar136._16_4_ =
       fVar93 * (float)bezier_basis0._5116_4_ +
       fVar81 * (float)bezier_basis0._6272_4_ +
       fVar42 * (float)bezier_basis0._8584_4_ + (float)bezier_basis0._7428_4_ * fVar23;
  auVar136._20_4_ =
       fVar98 * (float)bezier_basis0._5120_4_ +
       fVar85 * (float)bezier_basis0._6276_4_ +
       fVar43 * (float)bezier_basis0._8588_4_ + (float)bezier_basis0._7432_4_ * fVar39;
  auVar136._24_4_ =
       fVar101 * (float)bezier_basis0._5124_4_ +
       fVar87 * (float)bezier_basis0._6280_4_ +
       fVar57 * (float)bezier_basis0._8592_4_ + (float)bezier_basis0._7436_4_ * fVar40;
  auVar136._28_4_ = fVar63 + fVar63 + fVar63 + fVar41;
  auVar30 = vblendps_avx(auVar136,ZEXT832(0) << 0x20,1);
  auVar11._4_4_ = auVar30._4_4_ * 0.055555556;
  auVar11._0_4_ = auVar30._0_4_ * 0.055555556;
  auVar11._8_4_ = auVar30._8_4_ * 0.055555556;
  auVar11._12_4_ = auVar30._12_4_ * 0.055555556;
  auVar11._16_4_ = auVar30._16_4_ * 0.055555556;
  auVar11._20_4_ = auVar30._20_4_ * 0.055555556;
  auVar11._24_4_ = auVar30._24_4_ * 0.055555556;
  auVar11._28_4_ = auVar30._28_4_;
  auVar15 = vsubps_avx(auVar110,auVar11);
  auVar30 = vblendps_avx(auVar136,ZEXT832(0) << 0x20,0x80);
  auVar140._0_4_ = auVar110._0_4_ + auVar30._0_4_ * 0.055555556;
  auVar140._4_4_ = auVar110._4_4_ + auVar30._4_4_ * 0.055555556;
  auVar140._8_4_ = auVar110._8_4_ + auVar30._8_4_ * 0.055555556;
  auVar140._12_4_ = auVar110._12_4_ + auVar30._12_4_ * 0.055555556;
  auVar140._16_4_ = auVar110._16_4_ + auVar30._16_4_ * 0.055555556;
  auVar140._20_4_ = auVar110._20_4_ + auVar30._20_4_ * 0.055555556;
  auVar140._24_4_ = auVar110._24_4_ + auVar30._24_4_ * 0.055555556;
  auVar140._28_4_ = auVar110._28_4_ + auVar30._28_4_;
  auVar30._8_4_ = 0xff800000;
  auVar30._0_8_ = 0xff800000ff800000;
  auVar30._12_4_ = 0xff800000;
  auVar30._16_4_ = 0xff800000;
  auVar30._20_4_ = 0xff800000;
  auVar30._24_4_ = 0xff800000;
  auVar30._28_4_ = 0xff800000;
  auVar30 = vmaxps_avx(auVar30,auVar110);
  auVar10 = vmaxps_avx(auVar15,auVar140);
  auVar11 = vmaxps_avx(auVar30,auVar10);
  auVar53 = vpermilps_avx(auVar123,0);
  auVar82 = vpermilps_avx(auVar128,0);
  fVar42 = auVar53._0_4_;
  fVar43 = auVar53._4_4_;
  fVar57 = auVar53._8_4_;
  fVar63 = auVar53._12_4_;
  fVar23 = auVar82._0_4_;
  fVar39 = auVar82._4_4_;
  fVar40 = auVar82._8_4_;
  fVar41 = auVar82._12_4_;
  auVar53 = vpermilps_avx(_local_218,0);
  fVar81 = auVar53._0_4_;
  fVar85 = auVar53._4_4_;
  fVar87 = auVar53._8_4_;
  auVar82 = vpermilps_avx(_local_198,0);
  fVar93 = auVar82._0_4_;
  fVar98 = auVar82._4_4_;
  fVar101 = auVar82._8_4_;
  fVar102 = auVar82._12_4_;
  auVar130._0_4_ =
       fVar93 * (float)bezier_basis0._476_4_ +
       fVar81 * (float)bezier_basis0._1632_4_ +
       fVar42 * (float)bezier_basis0._2788_4_ + fVar23 * (float)bezier_basis0._3944_4_;
  auVar130._4_4_ =
       fVar98 * (float)bezier_basis0._480_4_ +
       fVar85 * (float)bezier_basis0._1636_4_ +
       fVar43 * (float)bezier_basis0._2792_4_ + fVar39 * (float)bezier_basis0._3948_4_;
  auVar130._8_4_ =
       fVar101 * (float)bezier_basis0._484_4_ +
       fVar87 * (float)bezier_basis0._1640_4_ +
       fVar57 * (float)bezier_basis0._2796_4_ + fVar40 * (float)bezier_basis0._3952_4_;
  auVar130._12_4_ =
       fVar102 * (float)bezier_basis0._488_4_ +
       auVar53._12_4_ * (float)bezier_basis0._1644_4_ +
       fVar63 * (float)bezier_basis0._2800_4_ + fVar41 * (float)bezier_basis0._3956_4_;
  auVar130._16_4_ =
       fVar93 * (float)bezier_basis0._492_4_ +
       fVar81 * (float)bezier_basis0._1648_4_ +
       fVar42 * (float)bezier_basis0._2804_4_ + fVar23 * (float)bezier_basis0._3960_4_;
  auVar130._20_4_ =
       fVar98 * (float)bezier_basis0._496_4_ +
       fVar85 * (float)bezier_basis0._1652_4_ +
       fVar43 * (float)bezier_basis0._2808_4_ + fVar39 * (float)bezier_basis0._3964_4_;
  auVar130._24_4_ =
       fVar101 * (float)bezier_basis0._500_4_ +
       fVar87 * (float)bezier_basis0._1656_4_ +
       fVar57 * (float)bezier_basis0._2812_4_ + fVar40 * (float)bezier_basis0._3968_4_;
  auVar130._28_4_ = auVar11._28_4_ + (float)bezier_basis0._504_4_ + auVar30._28_4_ + auVar10._28_4_;
  auVar31._0_4_ =
       fVar93 * (float)bezier_basis0._5100_4_ +
       fVar81 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar42 + (float)bezier_basis0._8568_4_ * fVar23;
  auVar31._4_4_ =
       fVar98 * (float)bezier_basis0._5104_4_ +
       fVar85 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar43 + (float)bezier_basis0._8572_4_ * fVar39;
  auVar31._8_4_ =
       fVar101 * (float)bezier_basis0._5108_4_ +
       fVar87 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar57 + (float)bezier_basis0._8576_4_ * fVar40;
  auVar31._12_4_ =
       fVar102 * (float)bezier_basis0._5112_4_ +
       auVar53._12_4_ * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * fVar63 + (float)bezier_basis0._8580_4_ * fVar41;
  auVar31._16_4_ =
       fVar93 * (float)bezier_basis0._5116_4_ +
       fVar81 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar42 + (float)bezier_basis0._8584_4_ * fVar23;
  auVar31._20_4_ =
       fVar98 * (float)bezier_basis0._5120_4_ +
       fVar85 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar43 + (float)bezier_basis0._8588_4_ * fVar39;
  auVar31._24_4_ =
       fVar101 * (float)bezier_basis0._5124_4_ +
       fVar87 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar57 + (float)bezier_basis0._8592_4_ * fVar40;
  auVar31._28_4_ = fVar63 + fVar63 + fVar63 + fVar41;
  auVar30 = vblendps_avx(auVar31,ZEXT832(0) << 0x20,1);
  auVar12._4_4_ = auVar30._4_4_ * 0.055555556;
  auVar12._0_4_ = auVar30._0_4_ * 0.055555556;
  auVar12._8_4_ = auVar30._8_4_ * 0.055555556;
  auVar12._12_4_ = auVar30._12_4_ * 0.055555556;
  auVar12._16_4_ = auVar30._16_4_ * 0.055555556;
  auVar12._20_4_ = auVar30._20_4_ * 0.055555556;
  auVar12._24_4_ = auVar30._24_4_ * 0.055555556;
  auVar12._28_4_ = auVar30._28_4_;
  auVar79 = vsubps_avx(auVar130,auVar12);
  auVar30 = vblendps_avx(auVar31,ZEXT832(0) << 0x20,0x80);
  auVar32._0_4_ = auVar130._0_4_ + auVar30._0_4_ * 0.055555556;
  auVar32._4_4_ = auVar130._4_4_ + auVar30._4_4_ * 0.055555556;
  auVar32._8_4_ = auVar130._8_4_ + auVar30._8_4_ * 0.055555556;
  auVar32._12_4_ = auVar130._12_4_ + auVar30._12_4_ * 0.055555556;
  auVar32._16_4_ = auVar130._16_4_ + auVar30._16_4_ * 0.055555556;
  auVar32._20_4_ = auVar130._20_4_ + auVar30._20_4_ * 0.055555556;
  auVar32._24_4_ = auVar130._24_4_ + auVar30._24_4_ * 0.055555556;
  auVar32._28_4_ = auVar130._28_4_ + auVar30._28_4_;
  auVar56._8_4_ = 0xff800000;
  auVar56._0_8_ = 0xff800000ff800000;
  auVar56._12_4_ = 0xff800000;
  auVar56._16_4_ = 0xff800000;
  auVar56._20_4_ = 0xff800000;
  auVar56._24_4_ = 0xff800000;
  auVar56._28_4_ = 0xff800000;
  auVar30 = vmaxps_avx(auVar56,auVar130);
  auVar10 = vmaxps_avx(auVar79,auVar32);
  auVar12 = vmaxps_avx(auVar30,auVar10);
  auVar10 = vminps_avx(auVar14,auVar80);
  auVar83._8_4_ = 0x7f800000;
  auVar83._0_8_ = 0x7f8000007f800000;
  auVar83._12_4_ = 0x7f800000;
  auVar83._16_4_ = 0x7f800000;
  auVar83._20_4_ = 0x7f800000;
  auVar83._24_4_ = 0x7f800000;
  auVar83._28_4_ = 0x7f800000;
  auVar14 = vminps_avx(auVar83,auVar135);
  auVar31 = vminps_avx(auVar14,auVar10);
  auVar10 = vminps_avx(auVar15,auVar140);
  auVar14 = vminps_avx(auVar83,auVar110);
  auVar56 = vminps_avx(auVar14,auVar10);
  auVar10 = vminps_avx(auVar79,auVar32);
  auVar14 = vminps_avx(auVar83,auVar130);
  auVar79 = vminps_avx(auVar14,auVar10);
  auVar25 = vsubps_avx(auVar139,_local_108);
  auVar53 = vshufps_avx(auVar25,auVar25,0x55);
  auVar82 = vshufps_avx(auVar25,auVar25,0xaa);
  auVar91 = vshufps_avx(auVar25,auVar25,0);
  auVar97._0_4_ = local_1f8 * auVar91._0_4_ + local_1b8 * auVar53._0_4_ + local_1d8 * auVar82._0_4_;
  auVar97._4_4_ =
       fStack_1f4 * auVar91._4_4_ + fStack_1b4 * auVar53._4_4_ + fStack_1d4 * auVar82._4_4_;
  auVar97._8_4_ =
       fStack_1f0 * auVar91._8_4_ + fStack_1b0 * auVar53._8_4_ + fStack_1d0 * auVar82._8_4_;
  auVar97._12_4_ =
       fStack_1ec * auVar91._12_4_ + fStack_1ac * auVar53._12_4_ + fStack_1cc * auVar82._12_4_;
  auVar91._4_4_ = fVar59;
  auVar91._0_4_ = fVar44;
  auVar91._8_4_ = fVar105;
  auVar91._12_4_ = fVar112;
  auVar53 = vsubps_avx(auVar46,auVar91);
  auVar29._0_4_ = auVar25._0_4_ + auVar53._0_4_ * 0.33333334;
  auVar29._4_4_ = auVar25._4_4_ + auVar53._4_4_ * 0.33333334;
  auVar29._8_4_ = auVar25._8_4_ + auVar53._8_4_ * 0.33333334;
  auVar29._12_4_ = auVar25._12_4_ + auVar53._12_4_ * 0.33333334;
  auVar53 = vshufps_avx(auVar29,auVar29,0x55);
  auVar82 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar91 = vshufps_avx(auVar29,auVar29,0);
  auVar129._0_4_ = local_1f8 * auVar91._0_4_ + local_1b8 * auVar53._0_4_ + local_1d8 * auVar82._0_4_
  ;
  auVar129._4_4_ =
       fStack_1f4 * auVar91._4_4_ + fStack_1b4 * auVar53._4_4_ + fStack_1d4 * auVar82._4_4_;
  auVar129._8_4_ =
       fStack_1f0 * auVar91._8_4_ + fStack_1b0 * auVar53._8_4_ + fStack_1d0 * auVar82._8_4_;
  auVar129._12_4_ =
       fStack_1ec * auVar91._12_4_ + fStack_1ac * auVar53._12_4_ + fStack_1cc * auVar82._12_4_;
  auVar82._4_4_ = fVar86;
  auVar82._0_4_ = fVar89;
  auVar82._8_4_ = fVar88;
  auVar82._12_4_ = fVar90;
  auVar25 = vsubps_avx(auVar99,auVar82);
  auVar53._4_4_ = fVar60;
  auVar53._0_4_ = fVar58;
  auVar53._8_4_ = fVar61;
  auVar53._12_4_ = fVar62;
  auVar53 = vsubps_avx(auVar45,auVar53);
  auVar73._0_4_ = auVar53._0_4_ * 0.33333334;
  auVar73._4_4_ = auVar53._4_4_ * 0.33333334;
  auVar73._8_4_ = auVar53._8_4_ * 0.33333334;
  auVar73._12_4_ = auVar53._12_4_ * 0.33333334;
  auVar91 = vsubps_avx(auVar25,auVar73);
  auVar53 = vshufps_avx(auVar91,auVar91,0x55);
  auVar82 = vshufps_avx(auVar91,auVar91,0xaa);
  auVar91 = vshufps_avx(auVar91,auVar91,0);
  auVar109._0_4_ = local_1f8 * auVar91._0_4_ + local_1b8 * auVar53._0_4_ + local_1d8 * auVar82._0_4_
  ;
  auVar109._4_4_ =
       fStack_1f4 * auVar91._4_4_ + fStack_1b4 * auVar53._4_4_ + fStack_1d4 * auVar82._4_4_;
  auVar109._8_4_ =
       fStack_1f0 * auVar91._8_4_ + fStack_1b0 * auVar53._8_4_ + fStack_1d0 * auVar82._8_4_;
  auVar109._12_4_ =
       fStack_1ec * auVar91._12_4_ + fStack_1ac * auVar53._12_4_ + fStack_1cc * auVar82._12_4_;
  auVar53 = vshufps_avx(auVar25,auVar25,0);
  auVar82 = vshufps_avx(auVar25,auVar25,0x55);
  auVar91 = vshufps_avx(auVar25,auVar25,0xaa);
  auVar100._0_4_ = local_1f8 * auVar53._0_4_ + local_1b8 * auVar82._0_4_ + local_1d8 * auVar91._0_4_
  ;
  auVar100._4_4_ =
       fStack_1f4 * auVar53._4_4_ + fStack_1b4 * auVar82._4_4_ + fStack_1d4 * auVar91._4_4_;
  auVar100._8_4_ =
       fStack_1f0 * auVar53._8_4_ + fStack_1b0 * auVar82._8_4_ + fStack_1d0 * auVar91._8_4_;
  auVar100._12_4_ =
       fStack_1ec * auVar53._12_4_ + fStack_1ac * auVar82._12_4_ + fStack_1cc * auVar91._12_4_;
  auVar53 = vshufps_avx(auVar109,auVar109,0xaa);
  auVar82 = vshufps_avx(auVar100,auVar100,0xaa);
  fVar42 = auVar53._0_4_;
  fVar43 = auVar53._4_4_;
  fVar57 = auVar53._8_4_;
  fVar58 = auVar53._12_4_;
  fVar23 = auVar82._0_4_;
  fVar39 = auVar82._4_4_;
  fVar40 = auVar82._8_4_;
  fVar41 = auVar82._12_4_;
  auVar53 = vshufps_avx(auVar129,auVar129,0xaa);
  fVar60 = auVar53._0_4_;
  fVar61 = auVar53._4_4_;
  fVar62 = auVar53._8_4_;
  auVar82 = vshufps_avx(auVar97,auVar97,0xaa);
  fVar44 = auVar82._0_4_;
  fVar59 = auVar82._4_4_;
  fVar105 = auVar82._8_4_;
  auVar137._0_4_ =
       fVar44 * (float)bezier_basis0._476_4_ +
       fVar60 * (float)bezier_basis0._1632_4_ +
       fVar42 * (float)bezier_basis0._2788_4_ + (float)bezier_basis0._3944_4_ * fVar23;
  auVar137._4_4_ =
       fVar59 * (float)bezier_basis0._480_4_ +
       fVar61 * (float)bezier_basis0._1636_4_ +
       fVar43 * (float)bezier_basis0._2792_4_ + (float)bezier_basis0._3948_4_ * fVar39;
  auVar137._8_4_ =
       fVar105 * (float)bezier_basis0._484_4_ +
       fVar62 * (float)bezier_basis0._1640_4_ +
       fVar57 * (float)bezier_basis0._2796_4_ + (float)bezier_basis0._3952_4_ * fVar40;
  auVar137._12_4_ =
       auVar82._12_4_ * (float)bezier_basis0._488_4_ +
       auVar53._12_4_ * (float)bezier_basis0._1644_4_ +
       fVar58 * (float)bezier_basis0._2800_4_ + (float)bezier_basis0._3956_4_ * fVar41;
  auVar137._16_4_ =
       fVar44 * (float)bezier_basis0._492_4_ +
       fVar60 * (float)bezier_basis0._1648_4_ +
       fVar42 * (float)bezier_basis0._2804_4_ + (float)bezier_basis0._3960_4_ * fVar23;
  auVar137._20_4_ =
       fVar59 * (float)bezier_basis0._496_4_ +
       fVar61 * (float)bezier_basis0._1652_4_ +
       fVar43 * (float)bezier_basis0._2808_4_ + (float)bezier_basis0._3964_4_ * fVar39;
  auVar137._24_4_ =
       fVar105 * (float)bezier_basis0._500_4_ +
       fVar62 * (float)bezier_basis0._1656_4_ +
       fVar57 * (float)bezier_basis0._2812_4_ + (float)bezier_basis0._3968_4_ * fVar40;
  auVar137._28_4_ = auVar30._28_4_ + 0.0;
  auVar33._0_4_ =
       fVar44 * (float)bezier_basis0._5100_4_ +
       fVar60 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar42 + (float)bezier_basis0._8568_4_ * fVar23;
  auVar33._4_4_ =
       fVar59 * (float)bezier_basis0._5104_4_ +
       fVar61 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar43 + (float)bezier_basis0._8572_4_ * fVar39;
  auVar33._8_4_ =
       fVar105 * (float)bezier_basis0._5108_4_ +
       fVar62 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar57 + (float)bezier_basis0._8576_4_ * fVar40;
  auVar33._12_4_ =
       auVar82._12_4_ * (float)bezier_basis0._5112_4_ +
       auVar53._12_4_ * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * fVar58 + (float)bezier_basis0._8580_4_ * fVar41;
  auVar33._16_4_ =
       fVar44 * (float)bezier_basis0._5116_4_ +
       fVar60 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar42 + (float)bezier_basis0._8584_4_ * fVar23;
  auVar33._20_4_ =
       fVar59 * (float)bezier_basis0._5120_4_ +
       fVar61 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar43 + (float)bezier_basis0._8588_4_ * fVar39;
  auVar33._24_4_ =
       fVar105 * (float)bezier_basis0._5124_4_ +
       fVar62 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar57 + (float)bezier_basis0._8592_4_ * fVar40;
  auVar33._28_4_ = fVar41 + fVar41 + fVar58 + fVar41;
  auVar30 = vblendps_avx(auVar33,ZEXT432(0) << 0x20,1);
  auVar14._4_4_ = auVar30._4_4_ * 0.055555556;
  auVar14._0_4_ = auVar30._0_4_ * 0.055555556;
  auVar14._8_4_ = auVar30._8_4_ * 0.055555556;
  auVar14._12_4_ = auVar30._12_4_ * 0.055555556;
  auVar14._16_4_ = auVar30._16_4_ * 0.055555556;
  auVar14._20_4_ = auVar30._20_4_ * 0.055555556;
  auVar14._24_4_ = auVar30._24_4_ * 0.055555556;
  auVar14._28_4_ = auVar30._28_4_;
  auVar32 = vsubps_avx(auVar137,auVar14);
  auVar30 = vblendps_avx(auVar33,ZEXT432(0) << 0x20,0x80);
  auVar131._0_4_ = auVar137._0_4_ + auVar30._0_4_ * 0.055555556;
  auVar131._4_4_ = auVar137._4_4_ + auVar30._4_4_ * 0.055555556;
  auVar131._8_4_ = auVar137._8_4_ + auVar30._8_4_ * 0.055555556;
  auVar131._12_4_ = auVar137._12_4_ + auVar30._12_4_ * 0.055555556;
  auVar131._16_4_ = auVar137._16_4_ + auVar30._16_4_ * 0.055555556;
  auVar131._20_4_ = auVar137._20_4_ + auVar30._20_4_ * 0.055555556;
  auVar131._24_4_ = auVar137._24_4_ + auVar30._24_4_ * 0.055555556;
  auVar131._28_4_ = auVar137._28_4_ + auVar30._28_4_;
  auVar34._8_4_ = 0xff800000;
  auVar34._0_8_ = 0xff800000ff800000;
  auVar34._12_4_ = 0xff800000;
  auVar34._16_4_ = 0xff800000;
  auVar34._20_4_ = 0xff800000;
  auVar34._24_4_ = 0xff800000;
  auVar34._28_4_ = 0xff800000;
  auVar30 = vmaxps_avx(auVar34,auVar137);
  auVar10 = vmaxps_avx(auVar32,auVar131);
  auVar14 = vmaxps_avx(auVar30,auVar10);
  auVar53 = vshufps_avx(auVar109,auVar109,0x55);
  auVar82 = vshufps_avx(auVar100,auVar100,0x55);
  fVar23 = auVar53._0_4_;
  fVar39 = auVar53._4_4_;
  fVar40 = auVar53._8_4_;
  fVar41 = auVar53._12_4_;
  fVar42 = auVar82._0_4_;
  fVar43 = auVar82._4_4_;
  fVar57 = auVar82._8_4_;
  auVar53 = vshufps_avx(auVar129,auVar129,0x55);
  fVar58 = auVar53._0_4_;
  fVar60 = auVar53._4_4_;
  fVar61 = auVar53._8_4_;
  auVar91 = vshufps_avx(auVar97,auVar97,0x55);
  fVar62 = auVar91._0_4_;
  fVar44 = auVar91._4_4_;
  fVar59 = auVar91._8_4_;
  auVar138._0_4_ =
       fVar58 * (float)bezier_basis0._1632_4_ +
       fVar23 * (float)bezier_basis0._2788_4_ + fVar42 * (float)bezier_basis0._3944_4_ +
       fVar62 * (float)bezier_basis0._476_4_;
  auVar138._4_4_ =
       fVar60 * (float)bezier_basis0._1636_4_ +
       fVar39 * (float)bezier_basis0._2792_4_ + fVar43 * (float)bezier_basis0._3948_4_ +
       fVar44 * (float)bezier_basis0._480_4_;
  auVar138._8_4_ =
       fVar61 * (float)bezier_basis0._1640_4_ +
       fVar40 * (float)bezier_basis0._2796_4_ + fVar57 * (float)bezier_basis0._3952_4_ +
       fVar59 * (float)bezier_basis0._484_4_;
  auVar138._12_4_ =
       auVar53._12_4_ * (float)bezier_basis0._1644_4_ +
       fVar41 * (float)bezier_basis0._2800_4_ + auVar82._12_4_ * (float)bezier_basis0._3956_4_ +
       auVar91._12_4_ * (float)bezier_basis0._488_4_;
  auVar138._16_4_ =
       fVar58 * (float)bezier_basis0._1648_4_ +
       fVar23 * (float)bezier_basis0._2804_4_ + fVar42 * (float)bezier_basis0._3960_4_ +
       fVar62 * (float)bezier_basis0._492_4_;
  auVar138._20_4_ =
       fVar60 * (float)bezier_basis0._1652_4_ +
       fVar39 * (float)bezier_basis0._2808_4_ + fVar43 * (float)bezier_basis0._3964_4_ +
       fVar44 * (float)bezier_basis0._496_4_;
  auVar138._24_4_ =
       fVar61 * (float)bezier_basis0._1656_4_ +
       fVar40 * (float)bezier_basis0._2812_4_ + fVar57 * (float)bezier_basis0._3968_4_ +
       fVar59 * (float)bezier_basis0._500_4_;
  auVar138._28_4_ = fVar102 + (float)bezier_basis0._3972_4_ + 0.0 + auVar14._28_4_;
  auVar35._0_4_ =
       fVar62 * (float)bezier_basis0._5100_4_ +
       fVar58 * (float)bezier_basis0._6256_4_ +
       fVar42 * (float)bezier_basis0._8568_4_ + fVar23 * (float)bezier_basis0._7412_4_;
  auVar35._4_4_ =
       fVar44 * (float)bezier_basis0._5104_4_ +
       fVar60 * (float)bezier_basis0._6260_4_ +
       fVar43 * (float)bezier_basis0._8572_4_ + fVar39 * (float)bezier_basis0._7416_4_;
  auVar35._8_4_ =
       fVar59 * (float)bezier_basis0._5108_4_ +
       fVar61 * (float)bezier_basis0._6264_4_ +
       fVar57 * (float)bezier_basis0._8576_4_ + fVar40 * (float)bezier_basis0._7420_4_;
  auVar35._12_4_ =
       auVar91._12_4_ * (float)bezier_basis0._5112_4_ +
       auVar53._12_4_ * (float)bezier_basis0._6268_4_ +
       auVar82._12_4_ * (float)bezier_basis0._8580_4_ + fVar41 * (float)bezier_basis0._7424_4_;
  auVar35._16_4_ =
       fVar62 * (float)bezier_basis0._5116_4_ +
       fVar58 * (float)bezier_basis0._6272_4_ +
       fVar42 * (float)bezier_basis0._8584_4_ + fVar23 * (float)bezier_basis0._7428_4_;
  auVar35._20_4_ =
       fVar44 * (float)bezier_basis0._5120_4_ +
       fVar60 * (float)bezier_basis0._6276_4_ +
       fVar43 * (float)bezier_basis0._8588_4_ + fVar39 * (float)bezier_basis0._7432_4_;
  auVar35._24_4_ =
       fVar59 * (float)bezier_basis0._5124_4_ +
       fVar61 * (float)bezier_basis0._6280_4_ +
       fVar57 * (float)bezier_basis0._8592_4_ + fVar40 * (float)bezier_basis0._7436_4_;
  auVar35._28_4_ = fVar41 + fVar41 + fVar41 + auVar14._28_4_;
  auVar30 = vblendps_avx(auVar35,ZEXT832(0) << 0x20,1);
  auVar15._4_4_ = auVar30._4_4_ * 0.055555556;
  auVar15._0_4_ = auVar30._0_4_ * 0.055555556;
  auVar15._8_4_ = auVar30._8_4_ * 0.055555556;
  auVar15._12_4_ = auVar30._12_4_ * 0.055555556;
  auVar15._16_4_ = auVar30._16_4_ * 0.055555556;
  auVar15._20_4_ = auVar30._20_4_ * 0.055555556;
  auVar15._24_4_ = auVar30._24_4_ * 0.055555556;
  auVar15._28_4_ = auVar30._28_4_;
  auVar33 = vsubps_avx(auVar138,auVar15);
  auVar30 = vblendps_avx(auVar35,ZEXT832(0) << 0x20,0x80);
  auVar141._0_4_ = auVar138._0_4_ + auVar30._0_4_ * 0.055555556;
  auVar141._4_4_ = auVar138._4_4_ + auVar30._4_4_ * 0.055555556;
  auVar141._8_4_ = auVar138._8_4_ + auVar30._8_4_ * 0.055555556;
  auVar141._12_4_ = auVar138._12_4_ + auVar30._12_4_ * 0.055555556;
  auVar141._16_4_ = auVar138._16_4_ + auVar30._16_4_ * 0.055555556;
  auVar141._20_4_ = auVar138._20_4_ + auVar30._20_4_ * 0.055555556;
  auVar141._24_4_ = auVar138._24_4_ + auVar30._24_4_ * 0.055555556;
  auVar141._28_4_ = auVar138._28_4_ + auVar30._28_4_;
  auVar36._8_4_ = 0xff800000;
  auVar36._0_8_ = 0xff800000ff800000;
  auVar36._12_4_ = 0xff800000;
  auVar36._16_4_ = 0xff800000;
  auVar36._20_4_ = 0xff800000;
  auVar36._24_4_ = 0xff800000;
  auVar36._28_4_ = 0xff800000;
  auVar30 = vmaxps_avx(auVar36,auVar138);
  auVar10 = vmaxps_avx(auVar33,auVar141);
  auVar15 = vmaxps_avx(auVar30,auVar10);
  auVar53 = vshufps_avx(auVar109,auVar109,0);
  fVar39 = auVar53._0_4_;
  fVar40 = auVar53._4_4_;
  fVar41 = auVar53._8_4_;
  fVar42 = auVar53._12_4_;
  auVar53 = vshufps_avx(auVar100,auVar100,0);
  fVar61 = auVar53._0_4_;
  fVar62 = auVar53._4_4_;
  fVar44 = auVar53._8_4_;
  fVar59 = auVar53._12_4_;
  fVar23 = auVar10._28_4_;
  auVar53 = vshufps_avx(auVar129,auVar129,0);
  fVar105 = auVar53._0_4_;
  fVar63 = auVar53._4_4_;
  fVar112 = auVar53._8_4_;
  auVar82 = vshufps_avx(auVar97,auVar97,0);
  fVar43 = auVar82._0_4_;
  fVar57 = auVar82._4_4_;
  fVar58 = auVar82._8_4_;
  fVar60 = auVar82._12_4_;
  auVar84._0_4_ =
       fVar43 * (float)bezier_basis0._476_4_ +
       fVar105 * (float)bezier_basis0._1632_4_ +
       fVar61 * (float)bezier_basis0._3944_4_ + fVar39 * (float)bezier_basis0._2788_4_;
  auVar84._4_4_ =
       fVar57 * (float)bezier_basis0._480_4_ +
       fVar63 * (float)bezier_basis0._1636_4_ +
       fVar62 * (float)bezier_basis0._3948_4_ + fVar40 * (float)bezier_basis0._2792_4_;
  auVar84._8_4_ =
       fVar58 * (float)bezier_basis0._484_4_ +
       fVar112 * (float)bezier_basis0._1640_4_ +
       fVar44 * (float)bezier_basis0._3952_4_ + fVar41 * (float)bezier_basis0._2796_4_;
  auVar84._12_4_ =
       fVar60 * (float)bezier_basis0._488_4_ +
       auVar53._12_4_ * (float)bezier_basis0._1644_4_ +
       fVar59 * (float)bezier_basis0._3956_4_ + fVar42 * (float)bezier_basis0._2800_4_;
  auVar84._16_4_ =
       fVar43 * (float)bezier_basis0._492_4_ +
       fVar105 * (float)bezier_basis0._1648_4_ +
       fVar61 * (float)bezier_basis0._3960_4_ + fVar39 * (float)bezier_basis0._2804_4_;
  auVar84._20_4_ =
       fVar57 * (float)bezier_basis0._496_4_ +
       fVar63 * (float)bezier_basis0._1652_4_ +
       fVar62 * (float)bezier_basis0._3964_4_ + fVar40 * (float)bezier_basis0._2808_4_;
  auVar84._24_4_ =
       fVar58 * (float)bezier_basis0._500_4_ +
       fVar112 * (float)bezier_basis0._1656_4_ +
       fVar44 * (float)bezier_basis0._3968_4_ + fVar41 * (float)bezier_basis0._2812_4_;
  auVar84._28_4_ = fVar23 + fVar23 + fVar23 + 0.055555556;
  auVar37._0_4_ =
       fVar43 * (float)bezier_basis0._5100_4_ +
       fVar105 * (float)bezier_basis0._6256_4_ +
       fVar39 * (float)bezier_basis0._7412_4_ + (float)bezier_basis0._8568_4_ * fVar61;
  auVar37._4_4_ =
       fVar57 * (float)bezier_basis0._5104_4_ +
       fVar63 * (float)bezier_basis0._6260_4_ +
       fVar40 * (float)bezier_basis0._7416_4_ + (float)bezier_basis0._8572_4_ * fVar62;
  auVar37._8_4_ =
       fVar58 * (float)bezier_basis0._5108_4_ +
       fVar112 * (float)bezier_basis0._6264_4_ +
       fVar41 * (float)bezier_basis0._7420_4_ + (float)bezier_basis0._8576_4_ * fVar44;
  auVar37._12_4_ =
       fVar60 * (float)bezier_basis0._5112_4_ +
       auVar53._12_4_ * (float)bezier_basis0._6268_4_ +
       fVar42 * (float)bezier_basis0._7424_4_ + (float)bezier_basis0._8580_4_ * fVar59;
  auVar37._16_4_ =
       fVar43 * (float)bezier_basis0._5116_4_ +
       fVar105 * (float)bezier_basis0._6272_4_ +
       fVar39 * (float)bezier_basis0._7428_4_ + (float)bezier_basis0._8584_4_ * fVar61;
  auVar37._20_4_ =
       fVar57 * (float)bezier_basis0._5120_4_ +
       fVar63 * (float)bezier_basis0._6276_4_ +
       fVar40 * (float)bezier_basis0._7432_4_ + (float)bezier_basis0._8588_4_ * fVar62;
  auVar37._24_4_ =
       fVar58 * (float)bezier_basis0._5124_4_ +
       fVar112 * (float)bezier_basis0._6280_4_ +
       fVar41 * (float)bezier_basis0._7436_4_ + (float)bezier_basis0._8592_4_ * fVar44;
  auVar37._28_4_ = fVar60 + (float)bezier_basis0._504_4_ + fVar42 + fVar59;
  auVar30 = vblendps_avx(auVar37,ZEXT832(0) << 0x20,1);
  auVar10 = vblendps_avx(auVar37,ZEXT832(0) << 0x20,0x80);
  auVar16._4_4_ = auVar30._4_4_ * 0.055555556;
  auVar16._0_4_ = auVar30._0_4_ * 0.055555556;
  auVar16._8_4_ = auVar30._8_4_ * 0.055555556;
  auVar16._12_4_ = auVar30._12_4_ * 0.055555556;
  auVar16._16_4_ = auVar30._16_4_ * 0.055555556;
  auVar16._20_4_ = auVar30._20_4_ * 0.055555556;
  auVar16._24_4_ = auVar30._24_4_ * 0.055555556;
  auVar16._28_4_ = auVar30._28_4_;
  auVar75._8_4_ = 0xff800000;
  auVar75._0_8_ = 0xff800000ff800000;
  auVar75._12_4_ = 0xff800000;
  auVar75._16_4_ = 0xff800000;
  auVar75._20_4_ = 0xff800000;
  auVar75._24_4_ = 0xff800000;
  auVar75._28_4_ = 0xff800000;
  auVar30 = vmaxps_avx(auVar75,auVar84);
  auVar16 = vsubps_avx(auVar84,auVar16);
  auVar38._0_4_ = auVar84._0_4_ + auVar10._0_4_ * 0.055555556;
  auVar38._4_4_ = auVar84._4_4_ + auVar10._4_4_ * 0.055555556;
  auVar38._8_4_ = auVar84._8_4_ + auVar10._8_4_ * 0.055555556;
  auVar38._12_4_ = auVar84._12_4_ + auVar10._12_4_ * 0.055555556;
  auVar38._16_4_ = auVar84._16_4_ + auVar10._16_4_ * 0.055555556;
  auVar38._20_4_ = auVar84._20_4_ + auVar10._20_4_ * 0.055555556;
  auVar38._24_4_ = auVar84._24_4_ + auVar10._24_4_ * 0.055555556;
  auVar38._28_4_ = auVar84._28_4_ + auVar10._28_4_;
  auVar10 = vmaxps_avx(auVar16,auVar38);
  auVar30 = vmaxps_avx(auVar30,auVar10);
  auVar10 = vminps_avx(auVar32,auVar131);
  auVar92._8_4_ = 0x7f800000;
  auVar92._0_8_ = 0x7f8000007f800000;
  auVar92._12_4_ = 0x7f800000;
  auVar92._16_4_ = 0x7f800000;
  auVar92._20_4_ = 0x7f800000;
  auVar92._24_4_ = 0x7f800000;
  auVar92._28_4_ = 0x7f800000;
  auVar32 = vminps_avx(auVar92,auVar137);
  auVar10 = vminps_avx(auVar32,auVar10);
  auVar32 = vminps_avx(auVar33,auVar141);
  auVar33 = vminps_avx(auVar92,auVar138);
  auVar32 = vminps_avx(auVar33,auVar32);
  auVar33 = vminps_avx(auVar92,auVar84);
  auVar16 = vminps_avx(auVar16,auVar38);
  auVar33 = vminps_avx(auVar33,auVar16);
  auVar16 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vmaxps_avx(auVar30,auVar16);
  auVar16 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar16);
  auVar53 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar30 = vshufps_avx(auVar15,auVar15,0xb1);
  auVar30 = vmaxps_avx(auVar15,auVar30);
  auVar15 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar15);
  auVar82 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar82 = vunpcklps_avx(auVar53,auVar82);
  auVar30 = vshufps_avx(auVar14,auVar14,0xb1);
  auVar30 = vmaxps_avx(auVar14,auVar30);
  auVar14 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar14);
  auVar53 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar53 = vinsertps_avx(auVar82,auVar53,0x28);
  auVar30 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar30 = vminps_avx(auVar33,auVar30);
  auVar14 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar14);
  auVar82 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar30 = vshufps_avx(auVar32,auVar32,0xb1);
  auVar30 = vminps_avx(auVar32,auVar30);
  auVar14 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar14);
  auVar91 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar91 = vunpcklps_avx(auVar82,auVar91);
  auVar30 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar30 = vminps_avx(auVar10,auVar30);
  auVar10 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar10);
  auVar82 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar82 = vinsertps_avx(auVar91,auVar82,0x28);
  auVar30 = vshufps_avx(auVar79,auVar79,0xb1);
  auVar30 = vminps_avx(auVar79,auVar30);
  auVar10 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar10);
  auVar91 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar30 = vshufps_avx(auVar56,auVar56,0xb1);
  auVar30 = vminps_avx(auVar56,auVar30);
  auVar10 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar10);
  auVar25 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar25 = vunpcklps_avx(auVar91,auVar25);
  auVar30 = vshufps_avx(auVar31,auVar31,0xb1);
  auVar30 = vminps_avx(auVar31,auVar30);
  auVar10 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vminps_avx(auVar30,auVar10);
  auVar91 = vminps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar91 = vinsertps_avx(auVar25,auVar91,0x28);
  auVar25 = vminps_avx(auVar82,auVar91);
  auVar30 = vshufps_avx(auVar12,auVar12,0xb1);
  auVar30 = vmaxps_avx(auVar12,auVar30);
  auVar10 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar10);
  auVar82 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar30 = vshufps_avx(auVar11,auVar11,0xb1);
  auVar30 = vmaxps_avx(auVar11,auVar30);
  auVar10 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar10);
  auVar91 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar91 = vunpcklps_avx(auVar82,auVar91);
  auVar30 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar30 = vmaxps_avx(auVar55,auVar30);
  auVar10 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar10);
  auVar82 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar82 = vinsertps_avx(auVar91,auVar82,0x28);
  auVar91 = vmaxps_avx(auVar53,auVar82);
  auVar74._8_4_ = 0x7fffffff;
  auVar74._0_8_ = 0x7fffffff7fffffff;
  auVar74._12_4_ = 0x7fffffff;
  auVar53 = vandps_avx(auVar25,auVar74);
  auVar82 = vandps_avx(auVar91,auVar74);
  auVar53 = vmaxps_avx(auVar53,auVar82);
  auVar82 = vmovshdup_avx(auVar53);
  auVar82 = vmaxss_avx(auVar82,auVar53);
  auVar53 = vshufpd_avx(auVar53,auVar53,1);
  auVar53 = vmaxss_avx(auVar53,auVar82);
  auVar53 = ZEXT416((uint)(auVar53._0_4_ * 4.7683716e-07));
  auVar53 = vshufps_avx(auVar53,auVar53,0);
  aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar25,auVar53);
  (__return_storage_ptr__->lower).field_0 = aVar13;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar91._0_4_ + auVar53._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar91._4_4_ + auVar53._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar91._8_4_ + auVar53._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar91._12_4_ + auVar53._12_4_;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }